

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromImage::verify
          (BufferCopyFromImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong *puVar1;
  uint uVar2;
  deUint32 dVar3;
  ulong uVar4;
  Random rng;
  deRandom local_30;
  
  deRandom_init(&local_30,this->m_seed);
  uVar2 = this->m_imageWidth * this->m_imageHeight;
  if ((uVar2 & 0x3fffffff) != 0) {
    uVar4 = 0;
    do {
      dVar3 = deRandom_getUint32(&local_30);
      *(char *)(*(long *)(ctx + 0x18) + uVar4) = (char)dVar3;
      puVar1 = (ulong *)(*(long *)(ctx + 0x30) + (uVar4 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 + 1;
      uVar2 = this->m_imageWidth * this->m_imageHeight * 4;
    } while (uVar4 < (ulong)(long)(int)uVar2);
  }
  return uVar2;
}

Assistant:

void BufferCopyFromImage::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference		(context.getReference());
	de::Random			rng	(m_seed);

	for (size_t ndx = 0; ndx < (size_t)(4 * m_imageWidth * m_imageHeight); ndx++)
		reference.set(ndx, rng.getUint8());
}